

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::CopyAELToSEL(Clipper *this)

{
  TEdge *local_18;
  TEdge *e;
  Clipper *this_local;
  
  local_18 = *(TEdge **)
              (this->_vptr_Clipper[-3] + 0x10 +
              (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
  this->m_SortedEdges = local_18;
  for (; local_18 != (TEdge *)0x0; local_18 = local_18->NextInAEL) {
    local_18->PrevInSEL = local_18->PrevInAEL;
    local_18->NextInSEL = local_18->NextInAEL;
  }
  return;
}

Assistant:

void Clipper::CopyAELToSEL()
{
  TEdge* e = m_ActiveEdges;
  m_SortedEdges = e;
  while ( e )
  {
    e->PrevInSEL = e->PrevInAEL;
    e->NextInSEL = e->NextInAEL;
    e = e->NextInAEL;
  }
}